

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPPacket::RTPPacket(RTPPacket *this,RTPRawPacket *rawpack,RTPMemoryManager *mgr)

{
  int iVar1;
  RTPTime RVar2;
  RTPMemoryManager *mgr_local;
  RTPRawPacket *rawpack_local;
  RTPPacket *this_local;
  
  RTPMemoryObject::RTPMemoryObject(&this->super_RTPMemoryObject,mgr);
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPPacket_00193b48;
  RVar2 = RTPRawPacket::GetReceiveTime(rawpack);
  (this->receivetime).m_t = RVar2.m_t;
  Clear(this);
  iVar1 = ParseRawPacket(this,rawpack);
  this->error = iVar1;
  return;
}

Assistant:

RTPPacket::RTPPacket(RTPRawPacket &rawpack,RTPMemoryManager *mgr) : RTPMemoryObject(mgr),receivetime(rawpack.GetReceiveTime())
{
	Clear();
	error = ParseRawPacket(rawpack);
}